

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::Code128Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code128Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  SymbologyIdentifier si;
  bool bVar5;
  int i;
  int iVar6;
  long lVar7;
  int *piVar8;
  Iterator puVar9;
  ushort uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  anon_class_16_2_7a905435 isGuard;
  uint local_140;
  ByteArray rawCodes;
  Error error;
  string local_f0;
  undefined7 local_d0;
  undefined1 uStack_c9;
  short sStack_c8;
  Type TStack_c6;
  Raw2TxtDecoder raw2txt;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  isGuard.minQuietZone = 5.0;
  isGuard.pattern = (FixedPattern<3,_4,_false> *)param_3;
  FindLeftGuard<3,ZXing::FindLeftGuard<3,4,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<3,4,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&raw2txt,(ZXing *)next,(PatternView *)0x18,0x198914,isGuard);
  next->_base = (Iterator)raw2txt.txt._M_dataplus._M_p;
  next->_end = (Iterator)raw2txt.txt._M_string_length;
  next->_data = (Iterator)raw2txt._0_8_;
  *(undefined8 *)&next->_size = raw2txt._8_8_;
  puVar9 = next->_data;
  if (((puVar9 == (Iterator)0x0) || (puVar9 < next->_base)) || (next->_end < puVar9 + next->_size))
  {
LAB_0015d796:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  next->_size = 6;
  raw2txt._0_16_ = NormalizedE2EPattern<6,_11>(next);
  lVar7 = 0;
  uVar12 = 0;
  do {
    bVar4 = (byte)(&raw2txt.codeSet)[lVar7];
    uVar13 = ~(uint)lVar7 & 1;
    uVar12 = (uVar13 << (bVar4 & 0x1f)) - uVar13 | uVar12 << (bVar4 & 0x1f);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  error._msg._M_dataplus._M_p._0_4_ = uVar12;
  piVar8 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>(&E2E_PATTERNS);
  iVar6 = -1;
  if (piVar8 != (int *)&DAT_001fce3c) {
    iVar6 = (int)((ulong)(piVar8 + -0x7f324) >> 2);
  }
  if (2 < iVar6 - 0x67U) goto LAB_0015d796;
  puVar9 = next->_base;
  if (puVar9 == next->_data) {
    local_140 = 0;
  }
  else {
    uVar10 = 0;
    do {
      uVar10 = uVar10 + *puVar9;
      puVar9 = puVar9 + 1;
    } while (puVar9 != next->_data);
    local_140 = (uint)uVar10;
  }
  rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0x14);
  raw2txt.codeSet._0_1_ = (char)iVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(uchar *)&raw2txt
            );
  Raw2TxtDecoder::Raw2TxtDecoder(&raw2txt,iVar6);
  do {
    if ((next->_data == (Iterator)0x0) ||
       (puVar9 = next->_data + next->_size, next->_data = puVar9, next->_end < puVar9 + next->_size)
       ) goto LAB_0015da9e;
    error._msg._0_16_ = NormalizedE2EPattern<6,_11>(next);
    lVar7 = 0;
    uVar12 = 0;
    do {
      bVar4 = *(byte *)((long)&error._msg._M_dataplus._M_p + lVar7 * 4);
      uVar13 = ~(uint)lVar7 & 1;
      uVar12 = (uVar13 << (bVar4 & 0x1f)) - uVar13 | uVar12 << (bVar4 & 0x1f);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    local_f0._M_dataplus._M_p._0_4_ = uVar12;
    piVar8 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (&E2E_PATTERNS,&DAT_001fce3c,&local_f0);
    iVar6 = (int)((ulong)(piVar8 + -0x7f324) >> 2);
    if (piVar8 == (int *)&DAT_001fce3c) {
      iVar6 = -1;
    }
    if (iVar6 == -1) {
      iVar6 = RowReader::DecodeDigit<ZXing::PatternView,std::array<std::array<int,6ul>,107ul>>
                        (next,(array<std::array<int,_6UL>,_107UL> *)Code128::CODE_PATTERNS,0.25,0.7,
                         true);
    }
    if (iVar6 == -1) {
LAB_0015d9af:
      memset(__return_storage_ptr__,0,0xd8);
      iVar14 = 1;
      Result::Result(__return_storage_ptr__);
    }
    else {
      iVar14 = 3;
      if (iVar6 != 0x6a) {
        if ((0x66 < iVar6) || (bVar5 = Raw2TxtDecoder::decode(&raw2txt,iVar6), !bVar5))
        goto LAB_0015d9af;
        error._msg._M_dataplus._M_p._0_1_ = (char)iVar6;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (uchar *)&error);
        iVar14 = 0;
      }
    }
  } while (iVar14 == 0);
  if (iVar14 != 3) goto LAB_0015dab5;
  iVar6 = (int)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
          (int)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (2 < iVar6) {
    puVar9 = next->_data;
    next->_size = 7;
    puVar1 = puVar9 + 7;
    if (puVar1 <= next->_end && (next->_base <= puVar9 && puVar9 != (Iterator)0x0)) {
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + *(short *)((long)puVar9 + lVar7);
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0xc);
      if (puVar9[6] <= uVar10 >> 2) {
        if (puVar1 != next->_end + -1) {
          lVar7 = 0;
          uVar10 = 0;
          do {
            uVar10 = uVar10 + *(short *)((long)puVar9 + lVar7);
            lVar7 = lVar7 + 2;
          } while (lVar7 != 0xe);
          if ((float)*puVar1 < (float)uVar10 * 0.3846154) goto LAB_0015da9e;
        }
        paVar2 = &error._msg.field_2;
        error._msg._M_string_length = 0;
        error._msg._M_dataplus._M_p = (pointer)paVar2;
        error._msg.field_2._M_local_buf[0] = '\0';
        error._file._0_7_ = 0;
        error._file._7_1_ = 0;
        error._line = -1;
        error._type = None;
        uVar12 = (uint)*rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
        iVar14 = 3;
        if (3 < iVar6) {
          iVar14 = iVar6;
        }
        uVar11 = 1;
        do {
          uVar12 = uVar12 + (uint)rawCodes.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11] * (int)uVar11;
          uVar11 = uVar11 + 1;
        } while (iVar14 - 1 != uVar11);
        if (uVar12 % 0x67 !=
            (uint)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]) {
          local_48 = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          local_f0.field_2._M_allocated_capacity._1_7_ = uStack_3f;
          local_f0.field_2._9_4_ = local_37;
          local_f0.field_2._13_2_ = local_33;
          local_f0.field_2._M_local_buf[0xf] = local_31;
          local_f0._M_string_length = 0;
          local_40 = 0;
          local_d0 = 0x198937;
          uStack_c9 = 0;
          sStack_c8 = 0xee;
          TStack_c6 = Checksum;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_50 = &local_40;
          std::__cxx11::string::operator=((string *)&error,(string *)&local_f0);
          error._line = sStack_c8;
          error._type = TStack_c6;
          error._file._0_7_ = local_d0;
          error._file._7_1_ = uStack_c9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
        }
        puVar9 = next->_base;
        if (puVar9 == next->_data + next->_size) {
          iVar6 = -1;
        }
        else {
          uVar10 = 0;
          do {
            uVar10 = uVar10 + *puVar9;
            puVar9 = puVar9 + 1;
          } while (puVar9 != next->_data + next->_size);
          iVar6 = uVar10 - 1;
        }
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)&raw2txt.txt);
        si = raw2txt._symbologyIdentifier;
        paVar3 = &local_80._msg.field_2;
        local_80._msg._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,error._msg._M_dataplus._M_p,
                   error._msg._M_dataplus._M_p + error._msg._M_string_length);
        local_80._file._0_7_ = error._file._0_7_;
        local_80._40_3_ =
             SUB43(CONCAT13(error._type,CONCAT21(error._line,error._file._7_1_)) >> 8,0);
        local_80._file._7_1_ = error._file._7_1_;
        Result::Result(__return_storage_ptr__,&local_f0,rowNumber,local_140,iVar6,Code128,si,
                       &local_80,raw2txt._readerInit);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._msg._M_dataplus._M_p != paVar3) {
          operator_delete(local_80._msg._M_dataplus._M_p,
                          local_80._msg.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error._msg._M_dataplus._M_p != paVar2) {
          operator_delete(error._msg._M_dataplus._M_p,
                          CONCAT71(error._msg.field_2._M_allocated_capacity._1_7_,
                                   error._msg.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0015dab5;
      }
    }
  }
LAB_0015da9e:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0015dab5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)raw2txt.txt._M_dataplus._M_p != &raw2txt.txt.field_2) {
    operator_delete(raw2txt.txt._M_dataplus._M_p,raw2txt.txt.field_2._M_allocated_capacity + 1);
  }
  if (rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

Barcode Code128Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	int minCharCount = 4; // start + payload + checksum + stop
	auto decodePattern = [](const PatternView& view, bool start = false) {
		// This is basically the reference algorithm from the specification
		int code = IndexOf(E2E_PATTERNS, ToInt(NormalizedE2EPattern<CHAR_LEN, CHAR_SUM>(view)));
		if (code == -1 && !start) // if the reference algo fails, give the original upstream version a try (required to decode a few samples)
			code = DecodeDigit(view, Code128::CODE_PATTERNS, MAX_AVG_VARIANCE, MAX_INDIVIDUAL_VARIANCE);
		return code;
	};

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN_PREFIX, QUIET_ZONE);
	if (!next.isValid())
		return {};

	next = next.subView(0, CHAR_LEN);
	int startCode = decodePattern(next, true);
	if (!(CODE_START_A <= startCode && startCode <= CODE_START_C))
		return {};

	int xStart = next.pixelsInFront();
	ByteArray rawCodes;
	rawCodes.reserve(20);
	rawCodes.push_back(narrow_cast<uint8_t>(startCode));

	Raw2TxtDecoder raw2txt(startCode);

	while (true) {
		if (!next.skipSymbol())
			return {};

		// Decode another code from image
		int code = decodePattern(next);
		if (code == -1)
			return {};
		if (code == CODE_STOP)
			break;
		if (code >= CODE_START_A)
			return {};
		if (!raw2txt.decode(code))
			return {};

		rawCodes.push_back(narrow_cast<uint8_t>(code));
	}

	if (Size(rawCodes) < minCharCount - 1) // stop code is missing in rawCodes
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone (next is now 13 modules
	// wide, require at least 8)
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE/13))
		return {};

	Error error;
	int checksum = rawCodes.front();
	for (int i = 1; i < Size(rawCodes) - 1; ++i)
		checksum += i * rawCodes[i];
	// the last code is the checksum:
	if (checksum % 103 != rawCodes.back())
		error = ChecksumError();

	int xStop = next.pixelsTillEnd();
	return Barcode(raw2txt.text(), rowNumber, xStart, xStop, BarcodeFormat::Code128, raw2txt.symbologyIdentifier(), error,
				   raw2txt.readerInit());
}